

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O1

bool QWindowSystemHelper<QWindowSystemInterface::DefaultDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::WheelEvent,QWindow*,unsigned_long,QPointF,QPointF,QPoint,QPoint,int,Qt::Orientation,QFlags<Qt::KeyboardModifier>,Qt::ScrollPhase,Qt::MouseEventSource,bool,QPointingDevice_const*>
               (QWindow *args,unsigned_long args_1,QPointF args_2,QPointF args_3,QPoint args_4,
               QPoint args_5,int args_6,Orientation args_7,QFlags<Qt::KeyboardModifier> args_8,
               ScrollPhase args_9,MouseEventSource args_10,bool args_11,QPointingDevice *args_12)

{
  bool bVar1;
  UserEvent *this;
  long *plVar2;
  qreal qVar3;
  
  qVar3 = args_3.yp;
  if (QWindowSystemInterfacePrivate::synchronousWindowSystemEvents) {
    bVar1 = QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
            handleEvent<QWindowSystemInterfacePrivate::WheelEvent,QWindow*,unsigned_long,QPointF,QPointF,QPoint,QPoint,int,Qt::Orientation,QFlags<Qt::KeyboardModifier>,Qt::ScrollPhase,Qt::MouseEventSource,bool,QPointingDevice_const*>
                      (args,args_1,args_2,args_3,args_4,args_5,args_6,args_7,args_8,args_9,args_10,
                       args_11,args_12);
    return bVar1;
  }
  this = (UserEvent *)operator_new(0x88);
  QWindowSystemInterfacePrivate::UserEvent::UserEvent(this,args,args_1,Wheel);
  *(QFlagsStorageHelper<Qt::KeyboardModifier,_4> *)
   &this[1].super_WindowSystemEvent._vptr_WindowSystemEvent =
       args_8.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
       super_QFlagsStorage<Qt::KeyboardModifier>.i;
  *(QPointingDevice **)&this[1].super_WindowSystemEvent.type = args_12;
  (this->super_WindowSystemEvent)._vptr_WindowSystemEvent = (_func_int **)&PTR__UserEvent_007e9ff0;
  *(QPoint *)&this[1].super_WindowSystemEvent.eventAccepted = args_4;
  this[1].window.wp.d = (Data *)args_5;
  *(int *)&this[1].window.wp.value = args_6;
  *(Orientation *)((long)&this[1].window.wp.value + 4) = args_7;
  this[1].timestamp = (unsigned_long)args_2.xp;
  this[2].super_WindowSystemEvent._vptr_WindowSystemEvent = (_func_int **)args_2.yp;
  *(qreal *)&this[2].super_WindowSystemEvent.type = args_3.xp;
  *(qreal *)&this[2].super_WindowSystemEvent.eventAccepted = qVar3;
  *(ScrollPhase *)&this[2].window.wp.d = args_9;
  *(MouseEventSource *)((long)&this[2].window.wp.d + 4) = args_10;
  *(bool *)&this[2].window.wp.value = args_11;
  QWindowSystemInterfacePrivate::WindowSystemEventList::append
            (&QWindowSystemInterfacePrivate::windowSystemEventQueue,(WindowSystemEvent *)this);
  if (QCoreApplication::self == 0) {
    plVar2 = (long *)0x0;
  }
  else {
    plVar2 = *(long **)(*(long *)(*(long *)(QCoreApplication::self + 8) + 0x58) + 0x60);
  }
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 0xa0))();
  }
  return true;
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::DefaultDelivery>::handleEvent(Args ...args)
{
    return QWindowSystemInterfacePrivate::synchronousWindowSystemEvents
        ? QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent<EventType>(args...)
        : QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
}